

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::TransformationParameter::SharedCtor(TransformationParameter *this)

{
  this->_cached_size_ = 0;
  (this->mean_file_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->crop_size_ = 0;
  *(undefined4 *)((long)&this->crop_size_ + 3) = 0;
  this->scale_ = 1.0;
  return;
}

Assistant:

void TransformationParameter::SharedCtor() {
  _cached_size_ = 0;
  mean_file_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&crop_size_, 0, reinterpret_cast<char*>(&force_gray_) -
    reinterpret_cast<char*>(&crop_size_) + sizeof(force_gray_));
  scale_ = 1;
}